

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_LoadUndefinedToElementDynamic
               (Var instance,PropertyId propertyId,ScriptContext *scriptContext)

{
  BOOL BVar1;
  ThreadContext *threadContext;
  RecyclableObject *pRVar2;
  JavascriptLibrary *this;
  RecyclableObject *pRVar3;
  undefined1 local_40 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  BVar1 = HasOwnPropertyNoHostObject(instance,propertyId);
  if (BVar1 == 0) {
    pRVar2 = VarTo<Js::RecyclableObject>(instance);
    this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    pRVar3 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
    (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x1f])(pRVar2,(ulong)(uint)propertyId,pRVar3);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElementDynamic(Var instance, PropertyId propertyId, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndefDynamic, reentrancylock, scriptContext->GetThreadContext());
        if (!JavascriptOperators::HasOwnPropertyNoHostObject(instance, propertyId))
        {
            VarTo<RecyclableObject>(instance)->InitPropertyScoped(propertyId, scriptContext->GetLibrary()->GetUndefined());
        }
        JIT_HELPER_END(Op_LdElemUndefDynamic);
    }